

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int findpara(void)

{
  int iVar1;
  bool bVar2;
  buffer *pbVar3;
  mgwin *pmVar4;
  ushort **ppuVar5;
  long lVar6;
  line *plVar7;
  
  pmVar4 = curwp;
  pbVar3 = curbp;
  plVar7 = curwp->w_dotp;
  do {
    pmVar4->w_doto = 0;
    iVar1 = plVar7->l_used;
    if (0 < (long)iVar1) {
      ppuVar5 = __ctype_b_loc();
      lVar6 = 0;
      bVar2 = false;
      do {
        if ((*(byte *)((long)*ppuVar5 + (ulong)(byte)plVar7->l_text[lVar6] * 2 + 1) & 0x20) == 0) {
          bVar2 = true;
        }
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
      if (bVar2) {
        return 1;
      }
    }
    plVar7 = plVar7->l_fp;
    if (plVar7 == pbVar3->b_headp) {
      return 0;
    }
    pmVar4->w_dotp = plVar7;
    pmVar4->w_dotline = pmVar4->w_dotline + 1;
  } while( true );
}

Assistant:

int
findpara(void)
{
	int	col, nospace = 0;

	/* we move forward to find a para to mark */
	do {
		curwp->w_doto = 0;
		col = 0;

		/* check if we are on a blank line */
		while (col < llength(curwp->w_dotp)) {
			if (!isspace(lgetc(curwp->w_dotp, col)))
				nospace = 1;
			col++;
		}
		if (nospace)
			break;

		if (lforw(curwp->w_dotp) == curbp->b_headp)
			return (FALSE);

		curwp->w_dotp = lforw(curwp->w_dotp);	
		curwp->w_dotline++;
	} while (1);

	return (TRUE);
}